

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS ref_grid_create(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  uint uVar1;
  REF_GRID_conflict ref_mpi_ptr;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  REF_CELL *ref_cell_ptr;
  
  ref_mpi_ptr = (REF_GRID_conflict)malloc(0x110);
  *ref_grid_ptr = ref_mpi_ptr;
  if (ref_mpi_ptr == (REF_GRID_conflict)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x21,
           "ref_grid_create","malloc *ref_grid_ptr of REF_GRID_STRUCT NULL");
    uVar1 = 2;
  }
  else {
    uVar1 = ref_mpi_deep_copy((REF_MPI *)ref_mpi_ptr,ref_mpi);
    if (uVar1 == 0) {
      uVar1 = ref_node_create(&ref_mpi_ptr->node,ref_mpi_ptr->mpi);
      if (uVar1 == 0) {
        ref_cell_ptr = ref_mpi_ptr->cell;
        lVar4 = 0;
        do {
          uVar1 = ref_cell_create(ref_cell_ptr,(REF_CELL_TYPE)lVar4);
          if (uVar1 != 0) {
            pcVar3 = "cell create";
            uVar2 = 0x2c;
            goto LAB_001658f6;
          }
          lVar4 = lVar4 + 1;
          ref_cell_ptr = ref_cell_ptr + 1;
        } while (lVar4 != 0x10);
        ref_mpi_ptr->cell[0x10] = (REF_CELL)0x0;
        uVar1 = ref_geom_create(&ref_mpi_ptr->geom);
        if (uVar1 == 0) {
          uVar1 = ref_gather_create(&ref_mpi_ptr->gather);
          if (uVar1 == 0) {
            uVar1 = ref_adapt_create(&ref_mpi_ptr->adapt);
            if (uVar1 == 0) {
              ref_mpi_ptr->partitioner_seed = 0;
              ref_mpi_ptr->partitioner_full = 0;
              ref_mpi_ptr->meshb_version = 0;
              ref_mpi_ptr->coordinate_system = REF_GRID_XBYRZU;
              ref_mpi_ptr->interp = (REF_INTERP)0x0;
              ref_mpi_ptr->partitioner = REF_MIGRATE_RECOMMENDED;
              ref_mpi_ptr->partitioner_seed = 0;
              ref_mpi_ptr->unit = REF_GRID_M;
              ref_mpi_ptr->references[0] = (REF_DBL)&DAT_3ff0000000000000;
              ref_mpi_ptr->references[1] = (REF_DBL)&DAT_3ff0000000000000;
              ref_mpi_ptr->references[2] = (REF_DBL)&DAT_3ff0000000000000;
              ref_mpi_ptr->references[3] = (REF_DBL)&DAT_3ff0000000000000;
              ref_mpi_ptr->references[4] = 0.0;
              ref_mpi_ptr->references[5] = 0.0;
              ref_mpi_ptr->references[6] = 0.0;
              ref_mpi_ptr->twod = 0;
              ref_mpi_ptr->surf = 0;
              return 0;
            }
            pcVar3 = "adapt create";
            uVar2 = 0x33;
          }
          else {
            pcVar3 = "gather create";
            uVar2 = 0x32;
          }
        }
        else {
          pcVar3 = "geom create";
          uVar2 = 0x31;
        }
      }
      else {
        pcVar3 = "node create";
        uVar2 = 0x28;
      }
    }
    else {
      pcVar3 = "deep copy ref_mpi";
      uVar2 = 0x25;
    }
LAB_001658f6:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar2,
           "ref_grid_create",(ulong)uVar1,pcVar3);
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_grid_create(REF_GRID *ref_grid_ptr, REF_MPI ref_mpi) {
  REF_INT group;
  REF_GRID ref_grid;

  ref_malloc(*ref_grid_ptr, 1, REF_GRID_STRUCT);

  ref_grid = *ref_grid_ptr;

  RSS(ref_mpi_deep_copy(&ref_grid_mpi(ref_grid), ref_mpi), "deep copy ref_mpi");

  RSS(ref_node_create(&ref_grid_node(ref_grid), ref_grid_mpi(ref_grid)),
      "node create");

  for (group = 0; group < REF_CELL_N_TYPE; group++) {
    RSS(ref_cell_create(&ref_grid_cell(ref_grid, group), (REF_CELL_TYPE)group),
        "cell create");
  }

  ref_grid_cell(ref_grid, REF_CELL_N_TYPE) = NULL;

  RSS(ref_geom_create(&ref_grid_geom(ref_grid)), "geom create");
  RSS(ref_gather_create(&ref_grid_gather(ref_grid)), "gather create");
  RSS(ref_adapt_create(&(ref_grid->adapt)), "adapt create");
  ref_grid_interp(ref_grid) = NULL;

  ref_grid_partitioner(ref_grid) = REF_MIGRATE_RECOMMENDED;
  ref_grid_partitioner_seed(ref_grid) = 0;
  ref_grid_partitioner_full(ref_grid) = REF_FALSE;

  ref_grid_meshb_version(ref_grid) = 0;
  ref_grid_coordinate_system(ref_grid) = REF_GRID_XBYRZU;
  ref_grid_unit(ref_grid) = REF_GRID_M;
  ref_grid_reference(ref_grid, 0) = 1.0;
  ref_grid_reference(ref_grid, 1) = 1.0;
  ref_grid_reference(ref_grid, 2) = 1.0;
  ref_grid_reference(ref_grid, 3) = 1.0;
  ref_grid_reference(ref_grid, 4) = 0.0;
  ref_grid_reference(ref_grid, 5) = 0.0;
  ref_grid_reference(ref_grid, 6) = 0.0;

  ref_grid_twod(ref_grid) = REF_FALSE;
  ref_grid_surf(ref_grid) = REF_FALSE;

  return REF_SUCCESS;
}